

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O3

void __thiscall arith_uint256_tests::divide::test_method(divide *this)

{
  undefined8 uVar1;
  int iVar2;
  base_uint<256U> *pbVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  string_view str;
  string_view str_00;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  arith_uint256 D2L;
  arith_uint256 D1L;
  uint256 rv;
  check_type cVar14;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  assertion_result local_2a0;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  assertion_result local_f8;
  undefined8 uStack_e0;
  string local_d8;
  base_uint<256U> local_b8;
  base_uint<256U> local_98;
  string local_78;
  undefined1 local_58 [16];
  undefined8 local_48;
  assertion_result *paStack_40;
  long local_38;
  
  local_2a0.m_message.pn.pi_ = (sp_counted_base *)local_2a0.m_message.px;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  paStack_40 = (assertion_result *)0x0;
  local_58._0_8_ = (_func_int **)0x0;
  local_58._8_8_ = 0;
  str._M_str = "AD7133AC1977FA2B7";
  str._M_len = 0x11;
  base_blob<256U>::SetHexDeprecated((base_blob<256U> *)local_58,str);
  UintToArith256((arith_uint256 *)&local_98,(uint256 *)local_58);
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  paStack_40 = (assertion_result *)0x0;
  local_58._0_8_ = (_func_int **)0x0;
  local_58._8_8_ = 0;
  str_00._M_str = "ECD751716";
  str_00._M_len = 9;
  base_blob<256U>::SetHexDeprecated((base_blob<256U> *)local_58,str_00);
  UintToArith256((arith_uint256 *)&local_b8,(uint256 *)local_58);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x169;
  file.m_begin = (iterator)&local_108;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  local_48._1_1_ = cRam00000000013c4731;
  local_48._0_1_ = DAT_013c4730;
  local_48._2_1_ = cRam00000000013c4732;
  local_48._3_1_ = cRam00000000013c4733;
  local_48._4_1_ = cRam00000000013c4734;
  local_48._5_1_ = cRam00000000013c4735;
  local_48._6_1_ = cRam00000000013c4736;
  local_48._7_1_ = uRam00000000013c4737;
  paStack_40._1_1_ = cRam00000000013c4739;
  paStack_40._0_1_ = cRam00000000013c4738;
  paStack_40._2_1_ = cRam00000000013c473a;
  paStack_40._3_1_ = cRam00000000013c473b;
  paStack_40._4_1_ = cRam00000000013c473c;
  paStack_40._5_1_ = cRam00000000013c473d;
  paStack_40._6_1_ = cRam00000000013c473e;
  paStack_40._7_1_ = uRam00000000013c473f;
  local_58._0_8_ =
       CONCAT17(R1L._7_1_,
                CONCAT16(R1L._6_1_,
                         CONCAT15(R1L._5_1_,
                                  CONCAT14(R1L._4_1_,
                                           CONCAT13(R1L._3_1_,
                                                    CONCAT12(R1L._2_1_,CONCAT11(R1L._1_1_,(char)R1L)
                                                            ))))));
  local_58._8_8_ =
       CONCAT17(cRam00000000013c472f,
                CONCAT16(cRam00000000013c472e,
                         CONCAT15(cRam00000000013c472d,
                                  CONCAT14(cRam00000000013c472c,
                                           CONCAT13(cRam00000000013c472b,
                                                    CONCAT12(cRam00000000013c472a,
                                                             CONCAT11(cRam00000000013c4729,
                                                                      cRam00000000013c4728)))))));
  pbVar3 = base_uint<256U>::operator/=((base_uint<256U> *)local_58,&local_98);
  local_d8._M_dataplus._M_p = *(pointer *)pbVar3->pn;
  uVar1 = *(undefined8 *)(pbVar3->pn + 2);
  local_d8.field_2._M_allocated_capacity = *(undefined8 *)(pbVar3->pn + 4);
  local_d8.field_2._8_8_ = *(undefined8 *)(pbVar3->pn + 6);
  local_d8._M_string_length._0_1_ = (char)uVar1;
  local_d8._M_string_length._1_1_ = (char)((ulong)uVar1 >> 8);
  local_d8._M_string_length._2_1_ = (char)((ulong)uVar1 >> 0x10);
  local_d8._M_string_length._3_1_ = (char)((ulong)uVar1 >> 0x18);
  local_d8._M_string_length._4_1_ = (char)((ulong)uVar1 >> 0x20);
  local_d8._M_string_length._5_1_ = (char)((ulong)uVar1 >> 0x28);
  local_d8._M_string_length._6_1_ = (char)((ulong)uVar1 >> 0x30);
  local_d8._M_string_length._7_1_ = (char)((ulong)uVar1 >> 0x38);
  base_uint<256u>::ToString_abi_cxx11_(&local_78,&local_d8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"00000000000000000b8ac01106981635d9ed112290f8895545a7654dde28fb3a");
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2a0._0_8_ =
       "(R1L / D1L).ToString() == \"00000000000000000b8ac01106981635d9ed112290f8895545a7654dde28fb3a\""
  ;
  local_2a0.m_message.px = (element_type *)0xe618b1;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_120 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  paStack_40 = &local_2a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar14,(size_t)&local_128,0x169);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x16a;
  file_00.m_begin = (iterator)&local_138;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
             msg_00);
  local_48._1_1_ = cRam00000000013c4731;
  local_48._0_1_ = DAT_013c4730;
  local_48._2_1_ = cRam00000000013c4732;
  local_48._3_1_ = cRam00000000013c4733;
  local_48._4_1_ = cRam00000000013c4734;
  local_48._5_1_ = cRam00000000013c4735;
  local_48._6_1_ = cRam00000000013c4736;
  local_48._7_1_ = uRam00000000013c4737;
  paStack_40._1_1_ = cRam00000000013c4739;
  paStack_40._0_1_ = cRam00000000013c4738;
  paStack_40._2_1_ = cRam00000000013c473a;
  paStack_40._3_1_ = cRam00000000013c473b;
  paStack_40._4_1_ = cRam00000000013c473c;
  paStack_40._5_1_ = cRam00000000013c473d;
  paStack_40._6_1_ = cRam00000000013c473e;
  paStack_40._7_1_ = uRam00000000013c473f;
  local_58._0_8_ =
       CONCAT17(R1L._7_1_,
                CONCAT16(R1L._6_1_,
                         CONCAT15(R1L._5_1_,
                                  CONCAT14(R1L._4_1_,
                                           CONCAT13(R1L._3_1_,
                                                    CONCAT12(R1L._2_1_,CONCAT11(R1L._1_1_,(char)R1L)
                                                            ))))));
  local_58._8_8_ =
       CONCAT17(cRam00000000013c472f,
                CONCAT16(cRam00000000013c472e,
                         CONCAT15(cRam00000000013c472d,
                                  CONCAT14(cRam00000000013c472c,
                                           CONCAT13(cRam00000000013c472b,
                                                    CONCAT12(cRam00000000013c472a,
                                                             CONCAT11(cRam00000000013c4729,
                                                                      cRam00000000013c4728)))))));
  pbVar3 = base_uint<256U>::operator/=((base_uint<256U> *)local_58,&local_b8);
  local_d8._M_dataplus._M_p = *(pointer *)pbVar3->pn;
  uVar1 = *(undefined8 *)(pbVar3->pn + 2);
  local_d8.field_2._M_allocated_capacity = *(undefined8 *)(pbVar3->pn + 4);
  local_d8.field_2._8_8_ = *(undefined8 *)(pbVar3->pn + 6);
  local_d8._M_string_length._0_1_ = (char)uVar1;
  local_d8._M_string_length._1_1_ = (char)((ulong)uVar1 >> 8);
  local_d8._M_string_length._2_1_ = (char)((ulong)uVar1 >> 0x10);
  local_d8._M_string_length._3_1_ = (char)((ulong)uVar1 >> 0x18);
  local_d8._M_string_length._4_1_ = (char)((ulong)uVar1 >> 0x20);
  local_d8._M_string_length._5_1_ = (char)((ulong)uVar1 >> 0x28);
  local_d8._M_string_length._6_1_ = (char)((ulong)uVar1 >> 0x30);
  local_d8._M_string_length._7_1_ = (char)((ulong)uVar1 >> 0x38);
  base_uint<256u>::ToString_abi_cxx11_(&local_78,&local_d8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"000000000873ce8efec5b67150bad3aa8c5fcb70e947586153bf2cec7c37c57a");
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2a0._0_8_ =
       "(R1L / D2L).ToString() == \"000000000873ce8efec5b67150bad3aa8c5fcb70e947586153bf2cec7c37c57a\""
  ;
  local_2a0.m_message.px = (element_type *)0xe6194f;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_150 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  paStack_40 = &local_2a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar14,(size_t)&local_158,0x16a);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x16b;
  file_01.m_begin = (iterator)&local_168;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_178,
             msg_01);
  local_48._1_1_ = cRam00000000013c4731;
  local_48._0_1_ = DAT_013c4730;
  local_48._2_1_ = cRam00000000013c4732;
  local_48._3_1_ = cRam00000000013c4733;
  local_48._4_1_ = cRam00000000013c4734;
  local_48._5_1_ = cRam00000000013c4735;
  local_48._6_1_ = cRam00000000013c4736;
  local_48._7_1_ = uRam00000000013c4737;
  paStack_40._1_1_ = cRam00000000013c4739;
  paStack_40._0_1_ = cRam00000000013c4738;
  paStack_40._2_1_ = cRam00000000013c473a;
  paStack_40._3_1_ = cRam00000000013c473b;
  paStack_40._4_1_ = cRam00000000013c473c;
  paStack_40._5_1_ = cRam00000000013c473d;
  paStack_40._6_1_ = cRam00000000013c473e;
  paStack_40._7_1_ = uRam00000000013c473f;
  local_58._0_8_ =
       CONCAT17(R1L._7_1_,
                CONCAT16(R1L._6_1_,
                         CONCAT15(R1L._5_1_,
                                  CONCAT14(R1L._4_1_,
                                           CONCAT13(R1L._3_1_,
                                                    CONCAT12(R1L._2_1_,CONCAT11(R1L._1_1_,(char)R1L)
                                                            ))))));
  local_58._8_8_ =
       CONCAT17(cRam00000000013c472f,
                CONCAT16(cRam00000000013c472e,
                         CONCAT15(cRam00000000013c472d,
                                  CONCAT14(cRam00000000013c472c,
                                           CONCAT13(cRam00000000013c472b,
                                                    CONCAT12(cRam00000000013c472a,
                                                             CONCAT11(cRam00000000013c4729,
                                                                      cRam00000000013c4728)))))));
  pbVar3 = base_uint<256U>::operator/=((base_uint<256U> *)local_58,(base_uint<256U> *)&OneL);
  local_78._M_dataplus._M_p = *(pointer *)pbVar3->pn;
  local_78._M_string_length._0_1_ = (char)pbVar3->pn[2];
  local_78._M_string_length._1_1_ = *(char *)((long)pbVar3->pn + 9);
  local_78._M_string_length._2_1_ = *(char *)((long)pbVar3->pn + 10);
  local_78._M_string_length._3_1_ = *(char *)((long)pbVar3->pn + 0xb);
  local_78._M_string_length._4_1_ = (char)pbVar3->pn[3];
  local_78._M_string_length._5_1_ = *(char *)((long)pbVar3->pn + 0xd);
  local_78._M_string_length._6_1_ = *(char *)((long)pbVar3->pn + 0xe);
  local_78._M_string_length._7_1_ = *(char *)((long)pbVar3->pn + 0xf);
  auVar6 = *(undefined1 (*) [16])(pbVar3->pn + 4);
  local_78.field_2._M_allocated_capacity = auVar6._0_8_;
  local_78.field_2._8_8_ = auVar6._8_8_;
  auVar10[0] = -(DAT_013c4730 == auVar6[0]);
  auVar10[1] = -(cRam00000000013c4731 == auVar6[1]);
  auVar10[2] = -(cRam00000000013c4732 == auVar6[2]);
  auVar10[3] = -(cRam00000000013c4733 == auVar6[3]);
  auVar10[4] = -(cRam00000000013c4734 == auVar6[4]);
  auVar10[5] = -(cRam00000000013c4735 == auVar6[5]);
  auVar10[6] = -(cRam00000000013c4736 == auVar6[6]);
  auVar10[7] = -(uRam00000000013c4737 == auVar6[7]);
  auVar10[8] = -(cRam00000000013c4738 == auVar6[8]);
  auVar10[9] = -(cRam00000000013c4739 == auVar6[9]);
  auVar10[10] = -(cRam00000000013c473a == auVar6[10]);
  auVar10[0xb] = -(cRam00000000013c473b == auVar6[0xb]);
  auVar10[0xc] = -(cRam00000000013c473c == auVar6[0xc]);
  auVar10[0xd] = -(cRam00000000013c473d == auVar6[0xd]);
  auVar10[0xe] = -(cRam00000000013c473e == auVar6[0xe]);
  auVar10[0xf] = -(uRam00000000013c473f == auVar6[0xf]);
  auVar6[0] = -((char)R1L == (char)pbVar3->pn[0]);
  auVar6[1] = -(R1L._1_1_ == *(char *)((long)pbVar3->pn + 1));
  auVar6[2] = -(R1L._2_1_ == *(char *)((long)pbVar3->pn + 2));
  auVar6[3] = -(R1L._3_1_ == *(char *)((long)pbVar3->pn + 3));
  auVar6[4] = -(R1L._4_1_ == (char)pbVar3->pn[1]);
  auVar6[5] = -(R1L._5_1_ == *(char *)((long)pbVar3->pn + 5));
  auVar6[6] = -(R1L._6_1_ == *(char *)((long)pbVar3->pn + 6));
  auVar6[7] = -(R1L._7_1_ == *(uchar *)((long)pbVar3->pn + 7));
  auVar6[8] = -(cRam00000000013c4728 == (char)local_78._M_string_length);
  auVar6[9] = -(cRam00000000013c4729 == local_78._M_string_length._1_1_);
  auVar6[10] = -(cRam00000000013c472a == local_78._M_string_length._2_1_);
  auVar6[0xb] = -(cRam00000000013c472b == local_78._M_string_length._3_1_);
  auVar6[0xc] = -(cRam00000000013c472c == local_78._M_string_length._4_1_);
  auVar6[0xd] = -(cRam00000000013c472d == local_78._M_string_length._5_1_);
  auVar6[0xe] = -(cRam00000000013c472e == local_78._M_string_length._6_1_);
  auVar6[0xf] = -(cRam00000000013c472f == local_78._M_string_length._7_1_);
  auVar6 = auVar6 & auVar10;
  local_d8._M_string_length._0_1_ = 0;
  local_d8._M_string_length._1_1_ = 0;
  local_d8._M_string_length._2_1_ = 0;
  local_d8._M_string_length._3_1_ = 0;
  local_d8._M_string_length._4_1_ = 0;
  local_d8._M_string_length._5_1_ = 0;
  local_d8._M_string_length._6_1_ = 0;
  local_d8._M_string_length._7_1_ = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_f8._0_8_ = "R1L / OneL == R1L";
  local_f8.m_message.px = (element_type *)0xe61961;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_180 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  paStack_40 = &local_f8;
  local_d8._M_dataplus._M_p._0_1_ =
       (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,(lazy_ostream *)local_58,1,0,WARN,_cVar14,
             (size_t)&local_188,0x16b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x16c;
  file_02.m_begin = (iterator)&local_198;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a8,
             msg_02);
  local_48._1_1_ = cRam00000000013c4731;
  local_48._0_1_ = DAT_013c4730;
  local_48._2_1_ = cRam00000000013c4732;
  local_48._3_1_ = cRam00000000013c4733;
  local_48._4_1_ = cRam00000000013c4734;
  local_48._5_1_ = cRam00000000013c4735;
  local_48._6_1_ = cRam00000000013c4736;
  local_48._7_1_ = uRam00000000013c4737;
  paStack_40._1_1_ = cRam00000000013c4739;
  paStack_40._0_1_ = cRam00000000013c4738;
  paStack_40._2_1_ = cRam00000000013c473a;
  paStack_40._3_1_ = cRam00000000013c473b;
  paStack_40._4_1_ = cRam00000000013c473c;
  paStack_40._5_1_ = cRam00000000013c473d;
  paStack_40._6_1_ = cRam00000000013c473e;
  paStack_40._7_1_ = uRam00000000013c473f;
  local_58._0_8_ =
       CONCAT17(R1L._7_1_,
                CONCAT16(R1L._6_1_,
                         CONCAT15(R1L._5_1_,
                                  CONCAT14(R1L._4_1_,
                                           CONCAT13(R1L._3_1_,
                                                    CONCAT12(R1L._2_1_,CONCAT11(R1L._1_1_,(char)R1L)
                                                            ))))));
  local_58._8_8_ =
       CONCAT17(cRam00000000013c472f,
                CONCAT16(cRam00000000013c472e,
                         CONCAT15(cRam00000000013c472d,
                                  CONCAT14(cRam00000000013c472c,
                                           CONCAT13(cRam00000000013c472b,
                                                    CONCAT12(cRam00000000013c472a,
                                                             CONCAT11(cRam00000000013c4729,
                                                                      cRam00000000013c4728)))))));
  pbVar3 = base_uint<256U>::operator/=((base_uint<256U> *)local_58,(base_uint<256U> *)&MaxL);
  local_78._M_dataplus._M_p = *(pointer *)pbVar3->pn;
  local_78._M_string_length._0_1_ = (char)pbVar3->pn[2];
  local_78._M_string_length._1_1_ = *(char *)((long)pbVar3->pn + 9);
  local_78._M_string_length._2_1_ = *(char *)((long)pbVar3->pn + 10);
  local_78._M_string_length._3_1_ = *(char *)((long)pbVar3->pn + 0xb);
  local_78._M_string_length._4_1_ = (char)pbVar3->pn[3];
  local_78._M_string_length._5_1_ = *(char *)((long)pbVar3->pn + 0xd);
  local_78._M_string_length._6_1_ = *(char *)((long)pbVar3->pn + 0xe);
  local_78._M_string_length._7_1_ = *(char *)((long)pbVar3->pn + 0xf);
  auVar6 = *(undefined1 (*) [16])(pbVar3->pn + 4);
  local_78.field_2._M_allocated_capacity = auVar6._0_8_;
  local_78.field_2._8_8_ = auVar6._8_8_;
  auVar11[0] = -(ZeroL[0x10] == auVar6[0]);
  auVar11[1] = -(ZeroL[0x11] == auVar6[1]);
  auVar11[2] = -(ZeroL[0x12] == auVar6[2]);
  auVar11[3] = -(ZeroL[0x13] == auVar6[3]);
  auVar11[4] = -(ZeroL[0x14] == auVar6[4]);
  auVar11[5] = -(ZeroL[0x15] == auVar6[5]);
  auVar11[6] = -(ZeroL[0x16] == auVar6[6]);
  auVar11[7] = -(ZeroL[0x17] == auVar6[7]);
  auVar11[8] = -(ZeroL[0x18] == auVar6[8]);
  auVar11[9] = -(ZeroL[0x19] == auVar6[9]);
  auVar11[10] = -(ZeroL[0x1a] == auVar6[10]);
  auVar11[0xb] = -(ZeroL[0x1b] == auVar6[0xb]);
  auVar11[0xc] = -(ZeroL[0x1c] == auVar6[0xc]);
  auVar11[0xd] = -(ZeroL[0x1d] == auVar6[0xd]);
  auVar11[0xe] = -(ZeroL[0x1e] == auVar6[0xe]);
  auVar11[0xf] = -(ZeroL[0x1f] == auVar6[0xf]);
  auVar7[0] = -(ZeroL[0] == (char)pbVar3->pn[0]);
  auVar7[1] = -(ZeroL[1] == *(char *)((long)pbVar3->pn + 1));
  auVar7[2] = -(ZeroL[2] == *(char *)((long)pbVar3->pn + 2));
  auVar7[3] = -(ZeroL[3] == *(char *)((long)pbVar3->pn + 3));
  auVar7[4] = -(ZeroL[4] == (char)pbVar3->pn[1]);
  auVar7[5] = -(ZeroL[5] == *(char *)((long)pbVar3->pn + 5));
  auVar7[6] = -(ZeroL[6] == *(char *)((long)pbVar3->pn + 6));
  auVar7[7] = -(ZeroL[7] == *(char *)((long)pbVar3->pn + 7));
  auVar7[8] = -(ZeroL[8] == (char)local_78._M_string_length);
  auVar7[9] = -(ZeroL[9] == local_78._M_string_length._1_1_);
  auVar7[10] = -(ZeroL[10] == local_78._M_string_length._2_1_);
  auVar7[0xb] = -(ZeroL[0xb] == local_78._M_string_length._3_1_);
  auVar7[0xc] = -(ZeroL[0xc] == local_78._M_string_length._4_1_);
  auVar7[0xd] = -(ZeroL[0xd] == local_78._M_string_length._5_1_);
  auVar7[0xe] = -(ZeroL[0xe] == local_78._M_string_length._6_1_);
  auVar7[0xf] = -(ZeroL[0xf] == local_78._M_string_length._7_1_);
  auVar7 = auVar7 & auVar11;
  local_d8._M_dataplus._M_p._0_1_ =
       (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff;
  local_d8._M_string_length._0_1_ = 0;
  local_d8._M_string_length._1_1_ = 0;
  local_d8._M_string_length._2_1_ = 0;
  local_d8._M_string_length._3_1_ = 0;
  local_d8._M_string_length._4_1_ = 0;
  local_d8._M_string_length._5_1_ = 0;
  local_d8._M_string_length._6_1_ = 0;
  local_d8._M_string_length._7_1_ = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_f8._0_8_ = "R1L / MaxL == ZeroL";
  local_f8.m_message.px = (element_type *)0xe61975;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1b0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  paStack_40 = &local_f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,(lazy_ostream *)local_58,1,0,WARN,_cVar14,
             (size_t)&local_1b8,0x16c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x16d;
  file_03.m_begin = (iterator)&local_1c8;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d8,
             msg_03);
  local_48._0_4_ = _DAT_013c47b0;
  local_48._4_4_ = DAT_013c47b0_4;
  paStack_40 = (assertion_result *)uRam00000000013c47b8;
  local_58._0_8_ = _MaxL;
  local_58._8_8_ = uRam00000000013c47a8;
  pbVar3 = base_uint<256U>::operator/=((base_uint<256U> *)local_58,(base_uint<256U> *)&R1L);
  local_78._M_dataplus._M_p = *(pointer *)pbVar3->pn;
  uVar1 = *(undefined8 *)(pbVar3->pn + 2);
  local_78.field_2._M_allocated_capacity = *(undefined8 *)(pbVar3->pn + 4);
  local_78.field_2._8_8_ = *(undefined8 *)(pbVar3->pn + 6);
  local_78._M_string_length._0_1_ = (char)uVar1;
  local_78._M_string_length._1_1_ = (char)((ulong)uVar1 >> 8);
  local_78._M_string_length._2_1_ = (char)((ulong)uVar1 >> 0x10);
  local_78._M_string_length._3_1_ = (char)((ulong)uVar1 >> 0x18);
  local_78._M_string_length._4_1_ = (char)((ulong)uVar1 >> 0x20);
  local_78._M_string_length._5_1_ = (char)((ulong)uVar1 >> 0x28);
  local_78._M_string_length._6_1_ = (char)((ulong)uVar1 >> 0x30);
  local_78._M_string_length._7_1_ = (char)((ulong)uVar1 >> 0x38);
  local_d8._M_dataplus._M_p._0_1_ = base_uint<256U>::EqualTo((base_uint<256U> *)&local_78,2);
  local_d8._M_string_length._0_1_ = 0;
  local_d8._M_string_length._1_1_ = 0;
  local_d8._M_string_length._2_1_ = 0;
  local_d8._M_string_length._3_1_ = 0;
  local_d8._M_string_length._4_1_ = 0;
  local_d8._M_string_length._5_1_ = 0;
  local_d8._M_string_length._6_1_ = 0;
  local_d8._M_string_length._7_1_ = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_f8._0_8_ = "MaxL / R1L == 2";
  local_f8.m_message.px = (element_type *)0xe61985;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1e0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  paStack_40 = &local_f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,(lazy_ostream *)local_58,1,0,WARN,_cVar14,
             (size_t)&local_1e8,0x16d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x16e;
  file_04.m_begin = (iterator)&local_1f8;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_208,
             msg_04);
  local_78.field_2._M_allocated_capacity =
       CONCAT17(uRam00000000013c4737,
                CONCAT16(cRam00000000013c4736,
                         CONCAT15(cRam00000000013c4735,
                                  CONCAT14(cRam00000000013c4734,
                                           CONCAT13(cRam00000000013c4733,
                                                    CONCAT12(cRam00000000013c4732,
                                                             CONCAT11(cRam00000000013c4731,
                                                                      DAT_013c4730)))))));
  local_78.field_2._8_8_ =
       CONCAT17(uRam00000000013c473f,
                CONCAT16(cRam00000000013c473e,
                         CONCAT15(cRam00000000013c473d,
                                  CONCAT14(cRam00000000013c473c,
                                           CONCAT13(cRam00000000013c473b,
                                                    CONCAT12(cRam00000000013c473a,
                                                             CONCAT11(cRam00000000013c4739,
                                                                      cRam00000000013c4738)))))));
  local_78._M_dataplus._M_p =
       (pointer)CONCAT17(R1L._7_1_,
                         CONCAT16(R1L._6_1_,
                                  CONCAT15(R1L._5_1_,
                                           CONCAT14(R1L._4_1_,
                                                    CONCAT13(R1L._3_1_,
                                                             CONCAT12(R1L._2_1_,
                                                                      CONCAT11(R1L._1_1_,(char)R1L))
                                                            )))));
  local_78._M_string_length._0_1_ = cRam00000000013c4728;
  local_78._M_string_length._1_1_ = cRam00000000013c4729;
  local_78._M_string_length._2_1_ = cRam00000000013c472a;
  local_78._M_string_length._3_1_ = cRam00000000013c472b;
  local_78._M_string_length._4_1_ = cRam00000000013c472c;
  local_78._M_string_length._5_1_ = cRam00000000013c472d;
  local_78._M_string_length._6_1_ = cRam00000000013c472e;
  local_78._M_string_length._7_1_ = cRam00000000013c472f;
  base_uint<256U>::operator/=((base_uint<256U> *)&local_78,(base_uint<256U> *)ZeroL);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x16e;
  file_05.m_begin = (iterator)&local_218;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_228,
             msg_05);
  local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffffffffff00;
  local_78._M_string_length._0_1_ = 0;
  local_78._M_string_length._1_1_ = 0;
  local_78._M_string_length._2_1_ = 0;
  local_78._M_string_length._3_1_ = 0;
  local_78._M_string_length._4_1_ = 0;
  local_78._M_string_length._5_1_ = 0;
  local_78._M_string_length._6_1_ = 0;
  local_78._M_string_length._7_1_ = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013aeb00;
  local_48 = boost::unit_test::lazy_ostream::inst;
  paStack_40 = (assertion_result *)0xe61986;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_230 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_58,1,1,WARN,_cVar14,
             (size_t)&local_238,0x16e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x16f;
  file_06.m_begin = (iterator)&local_278;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_288,
             msg_06);
  local_48._1_1_ = cRam00000000013c4751;
  local_48._0_1_ = DAT_013c4750;
  local_48._2_1_ = cRam00000000013c4752;
  local_48._3_1_ = cRam00000000013c4753;
  local_48._4_1_ = cRam00000000013c4754;
  local_48._5_1_ = cRam00000000013c4755;
  local_48._6_1_ = cRam00000000013c4756;
  local_48._7_1_ = uRam00000000013c4757;
  paStack_40._1_1_ = cRam00000000013c4759;
  paStack_40._0_1_ = cRam00000000013c4758;
  paStack_40._2_1_ = cRam00000000013c475a;
  paStack_40._3_1_ = cRam00000000013c475b;
  paStack_40._4_1_ = cRam00000000013c475c;
  paStack_40._5_1_ = cRam00000000013c475d;
  paStack_40._6_1_ = cRam00000000013c475e;
  paStack_40._7_1_ = uRam00000000013c475f;
  local_58._0_8_ =
       CONCAT17(DAT_013c4744._3_1_,
                CONCAT16(DAT_013c4744._2_1_,
                         CONCAT15(DAT_013c4744._1_1_,
                                  CONCAT14((char)DAT_013c4744,
                                           CONCAT13(R2L._3_1_,
                                                    CONCAT12(R2L._2_1_,CONCAT11(R2L._1_1_,(char)R2L)
                                                            ))))));
  local_58._8_8_ =
       CONCAT17(cRam00000000013c474f,
                CONCAT16(cRam00000000013c474e,
                         CONCAT15(cRam00000000013c474d,
                                  CONCAT14(cRam00000000013c474c,
                                           CONCAT13(cRam00000000013c474b,
                                                    CONCAT12(cRam00000000013c474a,
                                                             CONCAT11(cRam00000000013c4749,
                                                                      cRam00000000013c4748)))))));
  pbVar3 = base_uint<256U>::operator/=((base_uint<256U> *)local_58,&local_98);
  local_f8._0_8_ = *(undefined8 *)pbVar3->pn;
  local_f8.m_message = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)(pbVar3->pn + 2);
  uStack_e0 = *(undefined8 *)(pbVar3->pn + 6);
  base_uint<256u>::ToString_abi_cxx11_(&local_d8,&local_f8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_d8,"000000000000000013e1665895a1cc981de6d93670105a6b3ec3b73141b3a3c5");
  local_2a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_2a0.m_message.px = (element_type *)0x0;
  local_2a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "(R2L / D1L).ToString() == \"000000000000000013e1665895a1cc981de6d93670105a6b3ec3b73141b3a3c5\"";
  local_2a8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2b8 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  paStack_40 = (assertion_result *)&local_2b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a0,(lazy_ostream *)local_58,1,0,WARN,_cVar14,(size_t)&local_2c0,0x16f);
  boost::detail::shared_count::~shared_count(&local_2a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x170;
  file_07.m_begin = (iterator)&local_2d0;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e0,
             msg_07);
  local_48._1_1_ = cRam00000000013c4751;
  local_48._0_1_ = DAT_013c4750;
  local_48._2_1_ = cRam00000000013c4752;
  local_48._3_1_ = cRam00000000013c4753;
  local_48._4_1_ = cRam00000000013c4754;
  local_48._5_1_ = cRam00000000013c4755;
  local_48._6_1_ = cRam00000000013c4756;
  local_48._7_1_ = uRam00000000013c4757;
  paStack_40._1_1_ = cRam00000000013c4759;
  paStack_40._0_1_ = cRam00000000013c4758;
  paStack_40._2_1_ = cRam00000000013c475a;
  paStack_40._3_1_ = cRam00000000013c475b;
  paStack_40._4_1_ = cRam00000000013c475c;
  paStack_40._5_1_ = cRam00000000013c475d;
  paStack_40._6_1_ = cRam00000000013c475e;
  paStack_40._7_1_ = uRam00000000013c475f;
  local_58._0_8_ =
       CONCAT17(DAT_013c4744._3_1_,
                CONCAT16(DAT_013c4744._2_1_,
                         CONCAT15(DAT_013c4744._1_1_,
                                  CONCAT14((char)DAT_013c4744,
                                           CONCAT13(R2L._3_1_,
                                                    CONCAT12(R2L._2_1_,CONCAT11(R2L._1_1_,(char)R2L)
                                                            ))))));
  local_58._8_8_ =
       CONCAT17(cRam00000000013c474f,
                CONCAT16(cRam00000000013c474e,
                         CONCAT15(cRam00000000013c474d,
                                  CONCAT14(cRam00000000013c474c,
                                           CONCAT13(cRam00000000013c474b,
                                                    CONCAT12(cRam00000000013c474a,
                                                             CONCAT11(cRam00000000013c4749,
                                                                      cRam00000000013c4748)))))));
  pbVar3 = base_uint<256U>::operator/=((base_uint<256U> *)local_58,&local_b8);
  local_f8._0_8_ = *(undefined8 *)pbVar3->pn;
  local_f8.m_message = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)(pbVar3->pn + 2);
  uStack_e0 = *(undefined8 *)(pbVar3->pn + 6);
  base_uint<256u>::ToString_abi_cxx11_(&local_d8,&local_f8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_d8,"000000000e8f0abe753bb0afe2e9437ee85d280be60882cf0bd1aaf7fa3cc2c4");
  local_2a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 == 0);
  local_2a0.m_message.px = (element_type *)0x0;
  local_2a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "(R2L / D2L).ToString() == \"000000000e8f0abe753bb0afe2e9437ee85d280be60882cf0bd1aaf7fa3cc2c4\"";
  local_2a8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2e8 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  paStack_40 = (assertion_result *)&local_2b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a0,(lazy_ostream *)local_58,1,0,WARN,_cVar14,(size_t)&local_2f0,0x170);
  boost::detail::shared_count::~shared_count(&local_2a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x171;
  file_08.m_begin = (iterator)&local_300;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_310,
             msg_08);
  local_48._1_1_ = cRam00000000013c4751;
  local_48._0_1_ = DAT_013c4750;
  local_48._2_1_ = cRam00000000013c4752;
  local_48._3_1_ = cRam00000000013c4753;
  local_48._4_1_ = cRam00000000013c4754;
  local_48._5_1_ = cRam00000000013c4755;
  local_48._6_1_ = cRam00000000013c4756;
  local_48._7_1_ = uRam00000000013c4757;
  paStack_40._1_1_ = cRam00000000013c4759;
  paStack_40._0_1_ = cRam00000000013c4758;
  paStack_40._2_1_ = cRam00000000013c475a;
  paStack_40._3_1_ = cRam00000000013c475b;
  paStack_40._4_1_ = cRam00000000013c475c;
  paStack_40._5_1_ = cRam00000000013c475d;
  paStack_40._6_1_ = cRam00000000013c475e;
  paStack_40._7_1_ = uRam00000000013c475f;
  local_58._0_8_ =
       CONCAT17(DAT_013c4744._3_1_,
                CONCAT16(DAT_013c4744._2_1_,
                         CONCAT15(DAT_013c4744._1_1_,
                                  CONCAT14((char)DAT_013c4744,
                                           CONCAT13(R2L._3_1_,
                                                    CONCAT12(R2L._2_1_,CONCAT11(R2L._1_1_,(char)R2L)
                                                            ))))));
  local_58._8_8_ =
       CONCAT17(cRam00000000013c474f,
                CONCAT16(cRam00000000013c474e,
                         CONCAT15(cRam00000000013c474d,
                                  CONCAT14(cRam00000000013c474c,
                                           CONCAT13(cRam00000000013c474b,
                                                    CONCAT12(cRam00000000013c474a,
                                                             CONCAT11(cRam00000000013c4749,
                                                                      cRam00000000013c4748)))))));
  pbVar3 = base_uint<256U>::operator/=((base_uint<256U> *)local_58,(base_uint<256U> *)&OneL);
  local_d8._M_dataplus._M_p = *(pointer *)pbVar3->pn;
  local_d8._M_string_length._0_1_ = (char)pbVar3->pn[2];
  local_d8._M_string_length._1_1_ = *(char *)((long)pbVar3->pn + 9);
  local_d8._M_string_length._2_1_ = *(char *)((long)pbVar3->pn + 10);
  local_d8._M_string_length._3_1_ = *(char *)((long)pbVar3->pn + 0xb);
  local_d8._M_string_length._4_1_ = (char)pbVar3->pn[3];
  local_d8._M_string_length._5_1_ = *(char *)((long)pbVar3->pn + 0xd);
  local_d8._M_string_length._6_1_ = *(char *)((long)pbVar3->pn + 0xe);
  local_d8._M_string_length._7_1_ = *(char *)((long)pbVar3->pn + 0xf);
  auVar6 = *(undefined1 (*) [16])(pbVar3->pn + 4);
  local_d8.field_2._M_allocated_capacity = auVar6._0_8_;
  local_d8.field_2._8_8_ = auVar6._8_8_;
  auVar12[0] = -(DAT_013c4750 == auVar6[0]);
  auVar12[1] = -(cRam00000000013c4751 == auVar6[1]);
  auVar12[2] = -(cRam00000000013c4752 == auVar6[2]);
  auVar12[3] = -(cRam00000000013c4753 == auVar6[3]);
  auVar12[4] = -(cRam00000000013c4754 == auVar6[4]);
  auVar12[5] = -(cRam00000000013c4755 == auVar6[5]);
  auVar12[6] = -(cRam00000000013c4756 == auVar6[6]);
  auVar12[7] = -(uRam00000000013c4757 == auVar6[7]);
  auVar12[8] = -(cRam00000000013c4758 == auVar6[8]);
  auVar12[9] = -(cRam00000000013c4759 == auVar6[9]);
  auVar12[10] = -(cRam00000000013c475a == auVar6[10]);
  auVar12[0xb] = -(cRam00000000013c475b == auVar6[0xb]);
  auVar12[0xc] = -(cRam00000000013c475c == auVar6[0xc]);
  auVar12[0xd] = -(cRam00000000013c475d == auVar6[0xd]);
  auVar12[0xe] = -(cRam00000000013c475e == auVar6[0xe]);
  auVar12[0xf] = -(uRam00000000013c475f == auVar6[0xf]);
  auVar8[0] = -((char)R2L == (char)pbVar3->pn[0]);
  auVar8[1] = -(R2L._1_1_ == *(char *)((long)pbVar3->pn + 1));
  auVar8[2] = -(R2L._2_1_ == *(char *)((long)pbVar3->pn + 2));
  auVar8[3] = -(R2L._3_1_ == *(char *)((long)pbVar3->pn + 3));
  auVar8[4] = -((char)DAT_013c4744 == (char)pbVar3->pn[1]);
  auVar8[5] = -(DAT_013c4744._1_1_ == *(char *)((long)pbVar3->pn + 5));
  auVar8[6] = -(DAT_013c4744._2_1_ == *(char *)((long)pbVar3->pn + 6));
  auVar8[7] = -(DAT_013c4744._3_1_ == *(uchar *)((long)pbVar3->pn + 7));
  auVar8[8] = -(cRam00000000013c4748 == (char)local_d8._M_string_length);
  auVar8[9] = -(cRam00000000013c4749 == local_d8._M_string_length._1_1_);
  auVar8[10] = -(cRam00000000013c474a == local_d8._M_string_length._2_1_);
  auVar8[0xb] = -(cRam00000000013c474b == local_d8._M_string_length._3_1_);
  auVar8[0xc] = -(cRam00000000013c474c == local_d8._M_string_length._4_1_);
  auVar8[0xd] = -(cRam00000000013c474d == local_d8._M_string_length._5_1_);
  auVar8[0xe] = -(cRam00000000013c474e == local_d8._M_string_length._6_1_);
  auVar8[0xf] = -(cRam00000000013c474f == local_d8._M_string_length._7_1_);
  auVar8 = auVar8 & auVar12;
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2a0._0_8_ = "R2L / OneL == R2L";
  local_2a0.m_message.px = (element_type *)0xe61b2a;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_318 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  paStack_40 = &local_2a0;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff);
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar14,(size_t)&local_320,0x171);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x172;
  file_09.m_begin = (iterator)&local_330;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_340,
             msg_09);
  local_48._1_1_ = cRam00000000013c4751;
  local_48._0_1_ = DAT_013c4750;
  local_48._2_1_ = cRam00000000013c4752;
  local_48._3_1_ = cRam00000000013c4753;
  local_48._4_1_ = cRam00000000013c4754;
  local_48._5_1_ = cRam00000000013c4755;
  local_48._6_1_ = cRam00000000013c4756;
  local_48._7_1_ = uRam00000000013c4757;
  paStack_40._1_1_ = cRam00000000013c4759;
  paStack_40._0_1_ = cRam00000000013c4758;
  paStack_40._2_1_ = cRam00000000013c475a;
  paStack_40._3_1_ = cRam00000000013c475b;
  paStack_40._4_1_ = cRam00000000013c475c;
  paStack_40._5_1_ = cRam00000000013c475d;
  paStack_40._6_1_ = cRam00000000013c475e;
  paStack_40._7_1_ = uRam00000000013c475f;
  local_58._0_8_ =
       CONCAT17(DAT_013c4744._3_1_,
                CONCAT16(DAT_013c4744._2_1_,
                         CONCAT15(DAT_013c4744._1_1_,
                                  CONCAT14((char)DAT_013c4744,
                                           CONCAT13(R2L._3_1_,
                                                    CONCAT12(R2L._2_1_,CONCAT11(R2L._1_1_,(char)R2L)
                                                            ))))));
  local_58._8_8_ =
       CONCAT17(cRam00000000013c474f,
                CONCAT16(cRam00000000013c474e,
                         CONCAT15(cRam00000000013c474d,
                                  CONCAT14(cRam00000000013c474c,
                                           CONCAT13(cRam00000000013c474b,
                                                    CONCAT12(cRam00000000013c474a,
                                                             CONCAT11(cRam00000000013c4749,
                                                                      cRam00000000013c4748)))))));
  pbVar3 = base_uint<256U>::operator/=((base_uint<256U> *)local_58,(base_uint<256U> *)&MaxL);
  local_d8._M_dataplus._M_p = *(pointer *)pbVar3->pn;
  local_d8._M_string_length._0_1_ = (char)pbVar3->pn[2];
  local_d8._M_string_length._1_1_ = *(char *)((long)pbVar3->pn + 9);
  local_d8._M_string_length._2_1_ = *(char *)((long)pbVar3->pn + 10);
  local_d8._M_string_length._3_1_ = *(char *)((long)pbVar3->pn + 0xb);
  local_d8._M_string_length._4_1_ = (char)pbVar3->pn[3];
  local_d8._M_string_length._5_1_ = *(char *)((long)pbVar3->pn + 0xd);
  local_d8._M_string_length._6_1_ = *(char *)((long)pbVar3->pn + 0xe);
  local_d8._M_string_length._7_1_ = *(char *)((long)pbVar3->pn + 0xf);
  auVar6 = *(undefined1 (*) [16])(pbVar3->pn + 4);
  local_d8.field_2._M_allocated_capacity = auVar6._0_8_;
  local_d8.field_2._8_8_ = auVar6._8_8_;
  auVar13[0] = -(ZeroL[0x10] == auVar6[0]);
  auVar13[1] = -(ZeroL[0x11] == auVar6[1]);
  auVar13[2] = -(ZeroL[0x12] == auVar6[2]);
  auVar13[3] = -(ZeroL[0x13] == auVar6[3]);
  auVar13[4] = -(ZeroL[0x14] == auVar6[4]);
  auVar13[5] = -(ZeroL[0x15] == auVar6[5]);
  auVar13[6] = -(ZeroL[0x16] == auVar6[6]);
  auVar13[7] = -(ZeroL[0x17] == auVar6[7]);
  auVar13[8] = -(ZeroL[0x18] == auVar6[8]);
  auVar13[9] = -(ZeroL[0x19] == auVar6[9]);
  auVar13[10] = -(ZeroL[0x1a] == auVar6[10]);
  auVar13[0xb] = -(ZeroL[0x1b] == auVar6[0xb]);
  auVar13[0xc] = -(ZeroL[0x1c] == auVar6[0xc]);
  auVar13[0xd] = -(ZeroL[0x1d] == auVar6[0xd]);
  auVar13[0xe] = -(ZeroL[0x1e] == auVar6[0xe]);
  auVar13[0xf] = -(ZeroL[0x1f] == auVar6[0xf]);
  auVar9[0] = -(ZeroL[0] == (char)pbVar3->pn[0]);
  auVar9[1] = -(ZeroL[1] == *(char *)((long)pbVar3->pn + 1));
  auVar9[2] = -(ZeroL[2] == *(char *)((long)pbVar3->pn + 2));
  auVar9[3] = -(ZeroL[3] == *(char *)((long)pbVar3->pn + 3));
  auVar9[4] = -(ZeroL[4] == (char)pbVar3->pn[1]);
  auVar9[5] = -(ZeroL[5] == *(char *)((long)pbVar3->pn + 5));
  auVar9[6] = -(ZeroL[6] == *(char *)((long)pbVar3->pn + 6));
  auVar9[7] = -(ZeroL[7] == *(char *)((long)pbVar3->pn + 7));
  auVar9[8] = -(ZeroL[8] == (char)local_d8._M_string_length);
  auVar9[9] = -(ZeroL[9] == local_d8._M_string_length._1_1_);
  auVar9[10] = -(ZeroL[10] == local_d8._M_string_length._2_1_);
  auVar9[0xb] = -(ZeroL[0xb] == local_d8._M_string_length._3_1_);
  auVar9[0xc] = -(ZeroL[0xc] == local_d8._M_string_length._4_1_);
  auVar9[0xd] = -(ZeroL[0xd] == local_d8._M_string_length._5_1_);
  auVar9[0xe] = -(ZeroL[0xe] == local_d8._M_string_length._6_1_);
  auVar9[0xf] = -(ZeroL[0xf] == local_d8._M_string_length._7_1_);
  auVar9 = auVar9 & auVar13;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2a0._0_8_ = "R2L / MaxL == ZeroL";
  local_2a0.m_message.px = (element_type *)0xe61b3e;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_348 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  paStack_40 = &local_2a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar14,(size_t)&local_350,0x172);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x173;
  file_10.m_begin = (iterator)&local_360;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_370,
             msg_10);
  local_48._0_4_ = _DAT_013c47b0;
  local_48._4_4_ = DAT_013c47b0_4;
  paStack_40 = (assertion_result *)uRam00000000013c47b8;
  local_58._0_8_ = _MaxL;
  local_58._8_8_ = uRam00000000013c47a8;
  pbVar3 = base_uint<256U>::operator/=((base_uint<256U> *)local_58,(base_uint<256U> *)&R2L);
  local_d8._M_dataplus._M_p = *(pointer *)pbVar3->pn;
  uVar1 = *(undefined8 *)(pbVar3->pn + 2);
  local_d8.field_2._M_allocated_capacity = *(undefined8 *)(pbVar3->pn + 4);
  local_d8.field_2._8_8_ = *(undefined8 *)(pbVar3->pn + 6);
  local_d8._M_string_length._0_1_ = (char)uVar1;
  local_d8._M_string_length._1_1_ = (char)((ulong)uVar1 >> 8);
  local_d8._M_string_length._2_1_ = (char)((ulong)uVar1 >> 0x10);
  local_d8._M_string_length._3_1_ = (char)((ulong)uVar1 >> 0x18);
  local_d8._M_string_length._4_1_ = (char)((ulong)uVar1 >> 0x20);
  local_d8._M_string_length._5_1_ = (char)((ulong)uVar1 >> 0x28);
  local_d8._M_string_length._6_1_ = (char)((ulong)uVar1 >> 0x30);
  local_d8._M_string_length._7_1_ = (char)((ulong)uVar1 >> 0x38);
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)base_uint<256U>::EqualTo((base_uint<256U> *)&local_d8,1);
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2a0._0_8_ = "MaxL / R2L == 1";
  local_2a0.m_message.px = (element_type *)0xe61b4e;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_378 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  paStack_40 = &local_2a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar14,(size_t)&local_380,0x173);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x174;
  file_11.m_begin = (iterator)&local_390;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3a0,
             msg_11);
  local_48._1_1_ = cRam00000000013c4751;
  local_48._0_1_ = DAT_013c4750;
  local_48._2_1_ = cRam00000000013c4752;
  local_48._3_1_ = cRam00000000013c4753;
  local_48._4_1_ = cRam00000000013c4754;
  local_48._5_1_ = cRam00000000013c4755;
  local_48._6_1_ = cRam00000000013c4756;
  local_48._7_1_ = uRam00000000013c4757;
  paStack_40._1_1_ = cRam00000000013c4759;
  paStack_40._0_1_ = cRam00000000013c4758;
  paStack_40._2_1_ = cRam00000000013c475a;
  paStack_40._3_1_ = cRam00000000013c475b;
  paStack_40._4_1_ = cRam00000000013c475c;
  paStack_40._5_1_ = cRam00000000013c475d;
  paStack_40._6_1_ = cRam00000000013c475e;
  paStack_40._7_1_ = uRam00000000013c475f;
  local_58._0_8_ =
       CONCAT17(DAT_013c4744._3_1_,
                CONCAT16(DAT_013c4744._2_1_,
                         CONCAT15(DAT_013c4744._1_1_,
                                  CONCAT14((char)DAT_013c4744,
                                           CONCAT13(R2L._3_1_,
                                                    CONCAT12(R2L._2_1_,CONCAT11(R2L._1_1_,(char)R2L)
                                                            ))))));
  local_58._8_8_ =
       CONCAT17(cRam00000000013c474f,
                CONCAT16(cRam00000000013c474e,
                         CONCAT15(cRam00000000013c474d,
                                  CONCAT14(cRam00000000013c474c,
                                           CONCAT13(cRam00000000013c474b,
                                                    CONCAT12(cRam00000000013c474a,
                                                             CONCAT11(cRam00000000013c4749,
                                                                      cRam00000000013c4748)))))));
  base_uint<256U>::operator/=((base_uint<256U> *)local_58,(base_uint<256U> *)ZeroL);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x174;
  file_12.m_begin = (iterator)&local_3b0;
  msg_12.m_end = pvVar5;
  msg_12.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3c0,
             msg_12);
  local_d8._M_dataplus._M_p = local_d8._M_dataplus._M_p & 0xffffffffffffff00;
  local_d8._M_string_length._0_1_ = 0;
  local_d8._M_string_length._1_1_ = 0;
  local_d8._M_string_length._2_1_ = 0;
  local_d8._M_string_length._3_1_ = 0;
  local_d8._M_string_length._4_1_ = 0;
  local_d8._M_string_length._5_1_ = 0;
  local_d8._M_string_length._6_1_ = 0;
  local_d8._M_string_length._7_1_ = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013aeb00;
  local_48 = boost::unit_test::lazy_ostream::inst;
  paStack_40 = (assertion_result *)0xe61986;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_3c8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,(lazy_ostream *)local_58,1,1,WARN,_cVar14,
             (size_t)&local_3d0,0x174);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( divide )
{
    arith_uint256 D1L{arith_uint256S("AD7133AC1977FA2B7")};
    arith_uint256 D2L{arith_uint256S("ECD751716")};
    BOOST_CHECK((R1L / D1L).ToString() == "00000000000000000b8ac01106981635d9ed112290f8895545a7654dde28fb3a");
    BOOST_CHECK((R1L / D2L).ToString() == "000000000873ce8efec5b67150bad3aa8c5fcb70e947586153bf2cec7c37c57a");
    BOOST_CHECK(R1L / OneL == R1L);
    BOOST_CHECK(R1L / MaxL == ZeroL);
    BOOST_CHECK(MaxL / R1L == 2);
    BOOST_CHECK_THROW(R1L / ZeroL, uint_error);
    BOOST_CHECK((R2L / D1L).ToString() == "000000000000000013e1665895a1cc981de6d93670105a6b3ec3b73141b3a3c5");
    BOOST_CHECK((R2L / D2L).ToString() == "000000000e8f0abe753bb0afe2e9437ee85d280be60882cf0bd1aaf7fa3cc2c4");
    BOOST_CHECK(R2L / OneL == R2L);
    BOOST_CHECK(R2L / MaxL == ZeroL);
    BOOST_CHECK(MaxL / R2L == 1);
    BOOST_CHECK_THROW(R2L / ZeroL, uint_error);
}